

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O1

void __thiscall juzzlin::SimpleLogger::Impl::Impl(Impl *this,string *tag)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  long *unaff_R12;
  undefined8 *unaff_R15;
  
  this->m_activeLevel = Info;
  (this->m_lock)._M_device = (mutex_type *)m_mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)m_mutex);
  if (iVar3 == 0) {
    (this->m_tag)._M_dataplus._M_p = (pointer)&(this->m_tag).field_2;
    pcVar1 = (tag->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->m_tag,pcVar1,pcVar1 + tag->_M_string_length);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_message);
    return;
  }
  uVar2 = std::__throw_system_error(iVar3);
  if ((long *)*unaff_R15 != unaff_R12) {
    operator_delete((long *)*unaff_R15,*unaff_R12 + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this->m_lock)._M_device);
  _Unwind_Resume(uVar2);
}

Assistant:

SimpleLogger::Impl::Impl(const std::string & tag)
  : m_lock(m_mutex)
  , m_tag(tag)
{
}